

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_session.cc
# Opt level: O3

SSL_SESSION * SSL_get_session(SSL *ssl)

{
  _func_3149 *p_Var1;
  SSL_HANDSHAKE *hs;
  SSL_SESSION *pSVar2;
  
  p_Var1 = ssl->handshake_func;
  pSVar2 = *(SSL_SESSION **)(p_Var1 + 0x200);
  if (pSVar2 == (SSL_SESSION *)0x0) {
    hs = *(SSL_HANDSHAKE **)(p_Var1 + 0x118);
    if (hs == (SSL_HANDSHAKE *)0x0) {
      __assert_fail("hs != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_session.cc"
                    ,0x418,"SSL_SESSION *SSL_get_session(const SSL *)");
    }
    if (((byte)p_Var1[0xdc] & 0x10) != 0) {
      __assert_fail("!ssl->s3->initial_handshake_complete",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_session.cc"
                    ,0x419,"SSL_SESSION *SSL_get_session(const SSL *)");
    }
    pSVar2 = (SSL_SESSION *)
             (hs->early_session)._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
             ._M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
    if (pSVar2 == (SSL_SESSION *)0x0) {
      pSVar2 = (SSL_SESSION *)bssl::ssl_handshake_session(hs);
      return pSVar2;
    }
  }
  return pSVar2;
}

Assistant:

SSL_SESSION *SSL_get_session(const SSL *ssl) {
  // Once the initially handshake completes, we return the most recently
  // established session. In particular, if there is a pending renegotiation, we
  // do not return information about it until it completes.
  //
  // Code in the handshake must either use |hs->new_session| (if updating a
  // partial session) or |ssl_handshake_session| (if trying to query properties
  // consistently across TLS 1.2 resumption and other handshakes).
  if (ssl->s3->established_session != nullptr) {
    return ssl->s3->established_session.get();
  }

  // Otherwise, we must be in the initial handshake.
  SSL_HANDSHAKE *hs = ssl->s3->hs.get();
  assert(hs != nullptr);
  assert(!ssl->s3->initial_handshake_complete);

  // Return the 0-RTT session, if in the 0-RTT state. While the handshake has
  // not actually completed, the public accessors all report properties as if
  // it has.
  if (hs->early_session) {
    return hs->early_session.get();
  }

  // Otherwise, return the partial session.
  return (SSL_SESSION *)ssl_handshake_session(hs);
}